

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O0

void lj_ctype_freestate(global_State *g)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  long lVar3;
  CTState *in_RDI;
  CTState *cts;
  
  puVar2 = (undefined8 *)(ulong)*(uint *)(in_RDI->hash + 0x62);
  if (puVar2 != (undefined8 *)0x0) {
    lj_ccallback_mcode_free(in_RDI);
    uVar1 = *puVar2;
    lVar3 = (ulong)*(uint *)((long)puVar2 + 0xc) * 0x10;
    (in_RDI->cb).fpr[5].f[0] = (float)((int)(in_RDI->cb).fpr[5].f[0] - (int)lVar3);
    (in_RDI->cb).gpr[5] = lVar3 + (in_RDI->cb).gpr[5];
    (*(code *)(in_RDI->cb).fpr[3])((in_RDI->cb).fpr[4].d,uVar1,lVar3,0);
    uVar1 = puVar2[0x17];
    lVar3 = (ulong)*(uint *)(puVar2 + 0x18) * 2;
    (in_RDI->cb).fpr[5].f[0] = (float)((int)(in_RDI->cb).fpr[5].f[0] - (int)lVar3);
    (in_RDI->cb).gpr[5] = lVar3 + (in_RDI->cb).gpr[5];
    (*(code *)(in_RDI->cb).fpr[3])((in_RDI->cb).fpr[4].d,uVar1,lVar3,0);
    (in_RDI->cb).fpr[5].f[0] = (float)((int)(in_RDI->cb).fpr[5].f[0] + -0x1d0);
    (in_RDI->cb).gpr[5] = (in_RDI->cb).gpr[5] + 0x1d0;
    (*(code *)(in_RDI->cb).fpr[3])((in_RDI->cb).fpr[4].d,puVar2,0x1d0,0);
  }
  return;
}

Assistant:

void lj_ctype_freestate(global_State *g)
{
  CTState *cts = ctype_ctsG(g);
  if (cts) {
    lj_ccallback_mcode_free(cts);
    lj_mem_freevec(g, cts->tab, cts->sizetab, CType);
    lj_mem_freevec(g, cts->cb.cbid, cts->cb.sizeid, CTypeID1);
    lj_mem_freet(g, cts);
  }
}